

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# listing.cpp
# Opt level: O2

void listing(char *lst_filename,list<ast::Statement_*,_std::allocator<ast::Statement_*>_> *ast_root)

{
  long *plVar1;
  ostream *poVar2;
  char *pcVar3;
  _List_node_base *p_Var4;
  Statement *statement;
  ulong uVar5;
  long lVar6;
  time_t now;
  string line;
  string local_250 [32];
  ofstream lst;
  
  std::ofstream::ofstream(&lst,lst_filename,_S_out);
  now = time((time_t *)0x0);
  poVar2 = std::operator<<((ostream *)&lst,"P16 assembler v1.5 (Apr 27 2025)\t");
  poVar2 = std::operator<<(poVar2,lst_filename);
  poVar2 = std::operator<<(poVar2,'\t');
  pcVar3 = ctime(&now);
  poVar2 = std::operator<<(poVar2,pcVar3);
  std::endl<char,std::char_traits<char>>(poVar2);
  ast::Sections::listing((ostream *)&lst);
  ast::Symbols::listing((ostream *)&lst);
  poVar2 = std::operator<<((ostream *)&lst,"Code listing");
  std::endl<char,std::char_traits<char>>(poVar2);
  lVar6 = 1;
  p_Var4 = (_List_node_base *)ast_root;
  while (p_Var4 = (((_List_base<ast::Statement_*,_std::allocator<ast::Statement_*>_> *)
                   &p_Var4->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var4 != (_List_node_base *)ast_root) {
    plVar1 = (long *)p_Var4[1]._M_next;
    line._M_dataplus._M_p = (pointer)&line.field_2;
    line._M_string_length = 0;
    line.field_2._M_local_buf[0] = '\0';
    for (uVar5 = (ulong)(int)lVar6; (long)uVar5 < (long)(int)plVar1[6]; uVar5 = uVar5 + 1) {
      std::__cxx11::string::_M_assign((string *)&line);
      poVar2 = ostream_printf((ostream *)&lst,"%4d%11c\t",uVar5 & 0xffffffff,0x20);
      poVar2 = std::operator<<(poVar2,(string *)&line);
      std::endl<char,std::char_traits<char>>(poVar2);
    }
    std::__cxx11::string::_M_assign((string *)&line);
    (**(code **)(*plVar1 + 0x20))(local_250,plVar1);
    poVar2 = std::operator<<((ostream *)&lst,local_250);
    poVar2 = std::operator<<(poVar2,(string *)&line);
    std::endl<char,std::char_traits<char>>(poVar2);
    std::__cxx11::string::~string(local_250);
    (**(code **)(*plVar1 + 0x28))(local_250,plVar1);
    std::operator<<((ostream *)&lst,local_250);
    std::__cxx11::string::~string(local_250);
    lVar6 = uVar5 + 1;
    std::__cxx11::string::~string((string *)&line);
  }
  std::ofstream::close();
  std::ofstream::~ofstream(&lst);
  return;
}

Assistant:

void listing(const char *lst_filename, std::list<Statement*> *ast_root)
{
	try {
		std::ofstream lst (lst_filename);
		int current_line = 1;
		std::time_t now = std::time(0);
		lst << "P16 assembler v" VERSION " (" __DATE__ ")\t"
			<< lst_filename << '\t' << ctime(&now) << endl;

		Sections::listing(lst);
		Symbols::listing(lst);

		lst << "Code listing" << endl;
		for (auto s: *ast_root) {
			Statement *statement = s;
			std::string line;
			for (; current_line < statement->location.line; ++current_line) {
			//	linhas em branco e comentários
				line = srcfile[current_line - 1];
				ostream_printf(lst, "%4d%11c\t", current_line, ' ') << line << endl;
			}
			line = srcfile[current_line - 1];
			lst << statement->listing() << line << endl;
			lst << statement->more_listing();
			current_line++;
		}
		lst.close();
	} catch (std::ios_base::failure& e) {
		std::cerr << "IO exception: " << e.what() << endl;
	}
}